

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

int __thiscall QFileSystemModel::rmdir(QFileSystemModel *this,char *__path)

{
  byte bVar1;
  QFileSystemModelPrivate *this_00;
  long in_FS_OFFSET;
  QFileSystemModelPrivate *d;
  bool success;
  QString path;
  undefined7 in_stack_ffffffffffffff98;
  byte bVar2;
  QModelIndex *in_stack_ffffffffffffffc0;
  QFileSystemModel *in_stack_ffffffffffffffc8;
  QDir local_28 [8];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  filePath(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  QString::QString((QString *)0xaa9a77);
  QDir::QDir(local_28,(QString *)&stack0xffffffffffffffc0);
  bVar1 = QDir::rmdir((QString *)local_28);
  QDir::~QDir(local_28);
  QString::~QString((QString *)0xaa9aad);
  if ((bVar1 & 1) != 0) {
    bVar2 = bVar1;
    this_00 = d_func((QFileSystemModel *)0xaa9ac8);
    std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::operator->
              ((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)0xaa9ade);
    QFileInfoGatherer::removePath
              ((QFileInfoGatherer *)this_00,(QString *)CONCAT17(bVar2,in_stack_ffffffffffffff98));
  }
  QString::~QString((QString *)0xaa9afd);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),bVar1) & 0xffffff01;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemModel::rmdir(const QModelIndex &aindex)
{
    QString path = filePath(aindex);
    const bool success = QDir().rmdir(path);
#if QT_CONFIG(filesystemwatcher)
    if (success) {
        QFileSystemModelPrivate * d = const_cast<QFileSystemModelPrivate*>(d_func());
        d->fileInfoGatherer->removePath(path);
    }
#endif
    return success;
}